

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::Struct::_InternalSerialize
          (Struct *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  ulong uVar1;
  NodeBase *pNVar2;
  long lVar3;
  char *in_R9;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_3
  *this_00;
  string_view field_name;
  string_view field_name_00;
  const_iterator __begin4;
  
  internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)&(this->field_0)._impl_);
  if (*(int *)((long)&this->field_0 + 0x10) != 0) {
    this_00 = &(this->field_0)._impl_.fields_.
               super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
               .field_0;
    internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)&(this->field_0)._impl_);
    if ((stream->is_serialization_deterministic_ == true) &&
       (1 < (this_00->map_).
            super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_UntypedMapBase.num_elements_)) {
      internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
      ::MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                      *)&__begin4,&this_00->map_);
      for (lVar3 = 0; (long)__begin4.super_UntypedMapIterator.node_ << 3 != lVar3; lVar3 = lVar3 + 8
          ) {
        key = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               ((long)&(__begin4.super_UntypedMapIterator.m_)->num_elements_ + lVar3);
        target = internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(1,key,(Value *)(key + 1),target,stream);
        field_name._M_str = in_R9;
        field_name._M_len = (size_t)"google.protobuf.Struct.fields";
        internal::WireFormatLite::VerifyUtf8String
                  ((WireFormatLite *)(key->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)key->_M_string_length,1,0x1d,field_name);
      }
      std::unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_>::~unique_ptr
                ((unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> *)
                 &__begin4.super_UntypedMapIterator.m_);
    }
    else {
      internal::UntypedMapBase::begin
                (&__begin4.super_UntypedMapIterator,(UntypedMapBase *)&this_00->map_);
      while (pNVar2 = __begin4.super_UntypedMapIterator.node_,
            __begin4.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(__begin4.super_UntypedMapIterator.node_ + 1),
                                     (Value *)(__begin4.super_UntypedMapIterator.node_ + 5),target,
                                     stream);
        field_name_00._M_str = in_R9;
        field_name_00._M_len = (size_t)"google.protobuf.Struct.fields";
        internal::WireFormatLite::VerifyUtf8String
                  ((WireFormatLite *)pNVar2[1].next,(char *)(ulong)*(uint *)&pNVar2[2].next,1,0x1d,
                   field_name_00);
        internal::UntypedMapIterator::PlusPlus(&__begin4.super_UntypedMapIterator);
      }
    }
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    target = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Struct::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Struct& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Struct)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<string, .google.protobuf.Value> fields = 1;
  if (!this_._internal_fields().empty()) {
    using MapType = ::google::protobuf::Map<std::string, ::google::protobuf::Value>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, ::google::protobuf::Value,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_MESSAGE>;
    const auto& field = this_._internal_fields();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.first.data(), static_cast<int>(entry.first.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Struct.fields");
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.first.data(), static_cast<int>(entry.first.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Struct.fields");
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Struct)
  return target;
}